

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O1

void spvtools::CFA<spvtools::val::BasicBlock>::ComputeAugmentedCFG
               (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                *ordered_blocks,BasicBlock *pseudo_entry_block,BasicBlock *pseudo_exit_block,
               unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
               *augmented_successors_map,
               unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
               *augmented_predecessors_map,get_blocks_func *succ_func,get_blocks_func *pred_func)

{
  _Manager_type p_Var1;
  iterator iVar2;
  mapped_type *pmVar3;
  vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *pvVar4;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar5;
  pointer ppBVar6;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> sinks;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> reversed_blocks;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> sources;
  BasicBlock *local_130;
  BasicBlock *local_128;
  BasicBlock *local_120;
  BasicBlock *local_118;
  _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_110;
  _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_108;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> local_100;
  _Any_data local_e8;
  _Manager_type local_d8;
  _Invoker_type p_Stack_d0;
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type p_Stack_b0;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> local_a8;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> local_90;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (_Manager_type)0x0;
  p_Stack_b0 = (_Invoker_type)0x0;
  p_Var1 = (succ_func->super__Function_base)._M_manager;
  local_120 = pseudo_exit_block;
  local_118 = pseudo_entry_block;
  local_110 = (_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)augmented_successors_map;
  local_108 = (_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)augmented_predecessors_map;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_c8,(_Any_data *)succ_func,__clone_functor);
    p_Stack_b0 = succ_func->_M_invoker;
    local_b8 = (succ_func->super__Function_base)._M_manager;
  }
  local_48 = (_Manager_type)0x0;
  p_Stack_40 = (_Invoker_type)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  p_Var1 = (pred_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_58,(_Any_data *)pred_func,__clone_functor);
    p_Stack_40 = pred_func->_M_invoker;
    local_48 = (pred_func->super__Function_base)._M_manager;
  }
  TraversalRoots(&local_90,ordered_blocks,(get_blocks_func *)&local_c8,(get_blocks_func *)&local_58)
  ;
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_b8 != (_Manager_type)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  local_128 = (BasicBlock *)
              (ordered_blocks->
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_100.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (ordered_blocks->
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_a8.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
  _M_range_initialize<std::reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock**,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>>>
            ();
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = (_Manager_type)0x0;
  p_Stack_d0 = (_Invoker_type)0x0;
  p_Var1 = (pred_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_e8,(_Any_data *)pred_func,__clone_functor);
    p_Stack_d0 = pred_func->_M_invoker;
    local_d8 = (pred_func->super__Function_base)._M_manager;
  }
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = (_Invoker_type)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  p_Var1 = (succ_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_78,(_Any_data *)succ_func,__clone_functor);
    p_Stack_60 = succ_func->_M_invoker;
    local_68 = (succ_func->super__Function_base)._M_manager;
  }
  TraversalRoots(&local_100,&local_a8,(get_blocks_func *)&local_e8,(get_blocks_func *)&local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_d8 != (_Manager_type)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  pmVar3 = std::__detail::
           _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](local_110,&local_118);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::operator=
            (pmVar3,&local_90);
  for (ppBVar6 = local_90.
                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppBVar6 !=
      local_90.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppBVar6 = ppBVar6 + 1) {
    local_130 = *ppBVar6;
    pvVar4 = (vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
             std::__detail::
             _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_108,&local_130);
    local_128 = local_130;
    if ((pred_func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001aa869;
    pvVar5 = (*pred_func->_M_invoker)((_Any_data *)pred_func,&local_128);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::reserve
              ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
               pvVar4,((long)(pvVar5->
                             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar5->
                             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
    iVar2._M_current = *(BasicBlock ***)(pvVar4 + 8);
    if (iVar2._M_current == *(BasicBlock ***)(pvVar4 + 0x10)) {
      std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
      _M_realloc_insert<spvtools::val::BasicBlock*const&>(pvVar4,iVar2,&local_118);
    }
    else {
      *iVar2._M_current = local_118;
      *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 8;
    }
    std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>>
              (pvVar4,*(undefined8 *)(pvVar4 + 8),
               (pvVar5->
               super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (pvVar5->
               super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
  }
  pmVar3 = std::__detail::
           _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](local_108,&local_120);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::operator=
            (pmVar3,&local_100);
  if (local_100.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_100.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppBVar6 = local_100.
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_130 = *ppBVar6;
      pvVar4 = (vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
               std::__detail::
               _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_110,&local_130);
      local_128 = local_130;
      if ((succ_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001aa869:
        local_128 = local_130;
        std::__throw_bad_function_call();
      }
      pvVar5 = (*succ_func->_M_invoker)((_Any_data *)succ_func,&local_128);
      std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
      reserve((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
              pvVar4,((long)(pvVar5->
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar5->
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
      iVar2._M_current = *(BasicBlock ***)(pvVar4 + 8);
      if (iVar2._M_current == *(BasicBlock ***)(pvVar4 + 0x10)) {
        std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
        _M_realloc_insert<spvtools::val::BasicBlock*const&>(pvVar4,iVar2,&local_120);
      }
      else {
        *iVar2._M_current = local_120;
        *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 8;
      }
      std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>>
                (pvVar4,*(undefined8 *)(pvVar4 + 8),
                 (pvVar5->
                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar5->
                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      ppBVar6 = ppBVar6 + 1;
    } while (ppBVar6 !=
             local_100.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_100.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CFA<BB>::ComputeAugmentedCFG(
    std::vector<BB*>& ordered_blocks, BB* pseudo_entry_block,
    BB* pseudo_exit_block,
    std::unordered_map<const BB*, std::vector<BB*>>* augmented_successors_map,
    std::unordered_map<const BB*, std::vector<BB*>>* augmented_predecessors_map,
    get_blocks_func succ_func, get_blocks_func pred_func) {
  // Compute the successors of the pseudo-entry block, and
  // the predecessors of the pseudo exit block.
  auto sources = TraversalRoots(ordered_blocks, succ_func, pred_func);

  // For the predecessor traversals, reverse the order of blocks.  This
  // will affect the post-dominance calculation as follows:
  //  - Suppose you have blocks A and B, with A appearing before B in
  //    the list of blocks.
  //  - Also, A branches only to B, and B branches only to A.
  //  - We want to compute A as dominating B, and B as post-dominating B.
  // By using reversed blocks for predecessor traversal roots discovery,
  // we'll add an edge from B to the pseudo-exit node, rather than from A.
  // All this is needed to correctly process the dominance/post-dominance
  // constraint when A is a loop header that points to itself as its
  // own continue target, and B is the latch block for the loop.
  std::vector<BB*> reversed_blocks(ordered_blocks.rbegin(),
                                   ordered_blocks.rend());
  auto sinks = TraversalRoots(reversed_blocks, pred_func, succ_func);

  // Wire up the pseudo entry block.
  (*augmented_successors_map)[pseudo_entry_block] = sources;
  for (auto block : sources) {
    auto& augmented_preds = (*augmented_predecessors_map)[block];
    const auto preds = pred_func(block);
    augmented_preds.reserve(1 + preds->size());
    augmented_preds.push_back(pseudo_entry_block);
    augmented_preds.insert(augmented_preds.end(), preds->begin(), preds->end());
  }

  // Wire up the pseudo exit block.
  (*augmented_predecessors_map)[pseudo_exit_block] = sinks;
  for (auto block : sinks) {
    auto& augmented_succ = (*augmented_successors_map)[block];
    const auto succ = succ_func(block);
    augmented_succ.reserve(1 + succ->size());
    augmented_succ.push_back(pseudo_exit_block);
    augmented_succ.insert(augmented_succ.end(), succ->begin(), succ->end());
  }
}